

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O0

void rtmidi_open_virtual_port(RtMidiPtr device,char *portName)

{
  RtMidiError *err;
  allocator<char> local_39;
  string local_38 [8];
  string name;
  char *portName_local;
  RtMidiPtr device_local;
  
  name.field_2._8_8_ = portName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,portName,&local_39);
  std::allocator<char>::~allocator(&local_39);
  (**(code **)(*device->ptr + 8))(device->ptr,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void rtmidi_open_virtual_port (RtMidiPtr device, const char *portName)
{
    std::string name = portName;
    try {
        ((RtMidi*) device->ptr)->openVirtualPort (name);

    } catch (const RtMidiError & err) {
        device->ok  = false;
        device->msg = err.what ();
    }

}